

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::initializer_list<int>>
               (string *header,initializer_list<int> *list,Options *options)

{
  initializer_list<int> *in_RDX;
  string *in_RSI;
  int i;
  Options *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  uVar1 = 0;
  ::std::function<void(int,std::ostream&)>::
  function<ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::verifyAll<std::initializer_list<int>>(std::__cxx11::string_const&,std::initializer_list<int>const&,ApprovalTests::Options_const&)::_lambda(int,std::ostream&)_1_,void>
            ((function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)
             &stack0xffffffffffffffc0,(anon_class_8_1_54a39809 *)in_RSI);
  verifyAll<std::initializer_list<int>>
            (in_RSI,in_RDX,
             (function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  ::std::function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)>::~function
            ((function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)0x1719d2);
  return;
}

Assistant:

static void verifyAll(const std::string& header,
                              const Container& list,
                              const Options& options = Options())
        {
            int i = 0;
            verifyAll<Container>(
                header,
                list,
                [&](typename Container::value_type e, std::ostream& s) {
                    s << "[" << i++
                      << "] = " << TCompileTimeOptions::ToStringConverter::toString(e);
                },
                options);
        }